

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  secp256k1_context *ctx_local;
  
  if (ctx == secp256k1_context_no_precomp) {
    secp256k1_callback_call(&ctx->illegal_callback,"ctx != secp256k1_context_no_precomp");
  }
  if (ctx != (secp256k1_context *)0x0) {
    secp256k1_ecmult_context_clear(&ctx->ecmult_ctx);
    secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
  }
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_NO_RETURN(ctx != secp256k1_context_no_precomp);
    if (ctx != NULL) {
        secp256k1_ecmult_context_clear(&ctx->ecmult_ctx);
        secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
    }
}